

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  U32 local_38;
  uint local_34;
  U32 local_30;
  U32 u;
  U32 price;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  BYTE *literals_local;
  
  if (litLength == 0) {
    literals_local._4_4_ = 0;
  }
  else if (optPtr->priceType == zop_predef) {
    literals_local._4_4_ = litLength * 0x600;
  }
  else {
    local_30 = litLength * optPtr->litSumBasePrice;
    for (local_34 = 0; local_34 < litLength; local_34 = local_34 + 1) {
      if (optLevel == 0) {
        local_38 = ZSTD_bitWeight(optPtr->litFreq[literals[local_34]]);
      }
      else {
        local_38 = ZSTD_fracWeight(optPtr->litFreq[literals[local_34]]);
      }
      local_30 = local_30 - local_38;
    }
    literals_local._4_4_ = local_30;
  }
  return literals_local._4_4_;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;
    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}